

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.cc
# Opt level: O3

string * __thiscall
google::protobuf::util::converter::GetStringFromAny_abi_cxx11_
          (string *__return_storage_ptr__,converter *this,Any *any)

{
  undefined1 local_40 [8];
  StringValue s;
  
  StringValue::StringValue((StringValue *)local_40,(Arena *)0x0);
  MessageLite::ParseFromString((MessageLite *)local_40,*(string **)(this + 0x18));
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,
             *s.super_Message.super_MessageLite._internal_metadata_.ptr_,
             *(long *)((long)s.super_Message.super_MessageLite._internal_metadata_.ptr_ + 8) +
             *s.super_Message.super_MessageLite._internal_metadata_.ptr_);
  StringValue::~StringValue((StringValue *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string GetStringFromAny(const google::protobuf::Any& any) {
  google::protobuf::StringValue s;
  ParseFromAny(any.value(), &s);
  return s.value();
}